

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_ior(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  uint uVar1;
  mp_limb_t *pmVar2;
  mp_limb_t *pmVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong n;
  mp_srcptr xp;
  mp_size_t mVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  __mpz_struct *p_Var11;
  ulong uVar12;
  mp_limb_t mVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  
  uVar1 = u->_mp_size;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  n = (ulong)uVar4;
  uVar1 = v->_mp_size;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  p_Var11 = v;
  uVar16 = (ulong)uVar5;
  if (uVar4 < uVar5) {
    p_Var11 = u;
    uVar16 = n;
    n = (ulong)uVar5;
    u = v;
  }
  if (uVar16 == 0) {
    mpz_set(r,u);
    return;
  }
  uVar20 = (ulong)((uint)u->_mp_size >> 0x1f);
  uVar1 = p_Var11->_mp_size;
  uVar17 = (ulong)(uVar1 >> 0x1f);
  uVar8 = (ulong)((uVar1 | u->_mp_size) >> 0x1f);
  if ((int)uVar1 < 0) {
    n = uVar16;
  }
  if ((long)r->_mp_alloc < (long)(uVar8 + n)) {
    xp = mpz_realloc(r,uVar8 + n);
  }
  else {
    xp = r->_mp_d;
  }
  uVar9 = -uVar20;
  uVar10 = -uVar17;
  pmVar2 = u->_mp_d;
  pmVar3 = p_Var11->_mp_d;
  uVar15 = 0;
  uVar14 = uVar8;
  do {
    uVar18 = pmVar2[uVar15] ^ uVar9;
    uVar19 = uVar18 + uVar20;
    uVar20 = (ulong)CARRY8(uVar18,uVar20);
    uVar18 = pmVar3[uVar15] ^ uVar10;
    uVar12 = uVar18 + uVar17;
    uVar17 = (ulong)CARRY8(uVar18,uVar17);
    uVar18 = (uVar12 | uVar19) ^ -uVar8;
    mVar13 = uVar18 + uVar14;
    uVar14 = (ulong)CARRY8(uVar18,uVar14);
    xp[uVar15] = mVar13;
    uVar15 = uVar15 + 1;
  } while (uVar15 < uVar16);
  for (; uVar15 < n; uVar15 = uVar15 + 1) {
    uVar16 = pmVar2[uVar15] ^ uVar9;
    uVar17 = uVar16 + uVar20;
    uVar20 = (ulong)CARRY8(uVar16,uVar20);
    uVar16 = (uVar17 | uVar10) ^ -uVar8;
    mVar13 = uVar16 + uVar14;
    uVar14 = (ulong)CARRY8(uVar16,uVar14);
    xp[uVar15] = mVar13;
  }
  if (uVar14 == 0) {
    mVar7 = mpn_normalized_size(xp,n);
    iVar21 = (int)mVar7;
  }
  else {
    xp[n] = 1;
    iVar21 = (int)n + 1;
  }
  iVar6 = -iVar21;
  if (uVar8 == 0) {
    iVar6 = iVar21;
  }
  r->_mp_size = iVar6;
  return;
}

Assistant:

void
mpz_ior (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, rn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc | vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  /* If the smaller input is negative, by sign extension higher limbs
     don't matter. */
  rn = vx ? vn : un;

  rp = MPZ_REALLOC (r, rn + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = ( (ul | vl) ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < rn; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = ( (ul | vx) ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[rn++] = rc;
  else
    rn = mpn_normalized_size (rp, rn);

  r->_mp_size = rx ? -rn : rn;
}